

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenscanner.cpp
# Opt level: O1

string * __thiscall
TokenScanner::scanNumber_abi_cxx11_(string *__return_storage_ptr__,TokenScanner *this)

{
  int iVar1;
  string sStack_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  do {
    iVar1 = std::istream::get();
    if (9 < iVar1 - 0x30U) {
      sStack_50._M_dataplus._M_p = (pointer)&sStack_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&sStack_50,"Internal error: illegal call to scanNumber","");
      error(&sStack_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)sStack_50._M_dataplus._M_p != &sStack_50.field_2) {
        operator_delete(sStack_50._M_dataplus._M_p,sStack_50.field_2._M_allocated_capacity + 1);
      }
    }
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  } while( true );
}

Assistant:

string TokenScanner::scanNumber() {
   string token = "";
   NumberScannerState state = INITIAL_STATE;
   while (state != FINAL_STATE) {
      int ch = isp->get();
      int xch = 'e';
      switch (state) {
       case INITIAL_STATE:
         if (!isdigit(ch)) {
            error("Internal error: illegal call to scanNumber");
         }
         state = BEFORE_DECIMAL_POINT;
         break;
       case BEFORE_DECIMAL_POINT:
         if (ch == '.') {
            state = AFTER_DECIMAL_POINT;
         } else if (ch == 'E' || ch == 'e') {
            state = STARTING_EXPONENT;
            xch = ch;
         } else if (!isdigit(ch)) {
            if (ch != EOF) isp->unget();
            state = FINAL_STATE;
         }
         break;
       case AFTER_DECIMAL_POINT:
         if (ch == 'E' || ch == 'e') {
            state = STARTING_EXPONENT;
            xch = ch;
         } else if (!isdigit(ch)) {
            if (ch != EOF) isp->unget();
            state = FINAL_STATE;
         }
         break;
       case STARTING_EXPONENT:
         if (ch == '+' || ch == '-') {
            state = FOUND_EXPONENT_SIGN;
         } else if (isdigit(ch)) {
            state = SCANNING_EXPONENT;
         } else {
            if (ch != EOF) isp->unget();
            isp->unget();
            state = FINAL_STATE;
         }
         break;
       case FOUND_EXPONENT_SIGN:
         if (isdigit(ch)) {
            state = SCANNING_EXPONENT;
         } else {
            if (ch != EOF) isp->unget();
            isp->unget();
            isp->unget();
            state = FINAL_STATE;
         }
         break;
       case SCANNING_EXPONENT:
         if (!isdigit(ch)) {
            if (ch != EOF) isp->unget();
            state = FINAL_STATE;
         }
         break;
       default:
         state = FINAL_STATE;
         break;
      }
      if (state != FINAL_STATE) {
         token += char(ch);
      }
   }
   return token;
}